

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

ON_Xform * ON_Xform::TranslationTransformation(ON_Xform *__return_storage_ptr__,ON_3dVector *delta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  
  dVar1 = delta->x;
  dVar2 = delta->y;
  dVar3 = delta->z;
  pdVar5 = (double *)&IdentityTransformation;
  pdVar6 = (double *)__return_storage_ptr__;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pdVar6 = *pdVar5;
    pdVar5 = pdVar5 + 1;
    pdVar6 = pdVar6 + 1;
  }
  __return_storage_ptr__->m_xform[0][3] = dVar1;
  __return_storage_ptr__->m_xform[1][3] = dVar2;
  __return_storage_ptr__->m_xform[2][3] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform ON_Xform::TranslationTransformation(
  const ON_3dVector& delta
)
{
  return ON_Xform::TranslationTransformation(delta.x, delta.y, delta.z);
}